

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

void * flatcc_builder_start_struct(flatcc_builder_t *B,size_t size,uint16_t align)

{
  __flatcc_builder_frame_t *p_Var1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  
  iVar2 = enter_frame(B,align);
  if (iVar2 == 0) {
    p_Var1 = B->frame;
    p_Var1->type = 2;
    uVar4 = (int)B->buffers[1].iov_len - B->ds_first;
    B->ds = (uint8_t *)((ulong)B->ds_first + (long)B->buffers[1].iov_base);
    uVar3 = 0xfffffffc;
    if (uVar4 < 0xfffffffc) {
      uVar3 = uVar4;
    }
    B->ds_limit = uVar3;
    p_Var1->type_limit = 0xfffffffc;
    uVar4 = B->ds_offset;
    uVar5 = (int)size + uVar4;
    B->ds_offset = uVar5;
    if (uVar3 <= uVar5) {
      iVar2 = reserve_ds(B,(ulong)(uVar5 + 1),0xfffffffc);
      if (iVar2 != 0) goto LAB_001044e1;
    }
    puVar6 = B->ds + uVar4;
  }
  else {
LAB_001044e1:
    puVar6 = (uint8_t *)0x0;
  }
  return puVar6;
}

Assistant:

void *flatcc_builder_start_struct(flatcc_builder_t *B, size_t size, uint16_t align)
{
    /* Allocate space for the struct on the ds stack. */
    if (enter_frame(B, align)) {
        return 0;
    }
    frame(type) = flatcc_builder_struct;
    refresh_ds(B, data_limit);
    return push_ds(B, (uoffset_t)size);
}